

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::PatternSyntax::isKind(SyntaxKind kind)

{
  SyntaxKind kind_local;
  bool local_1;
  
  if ((((kind == ExpressionPattern) || (kind == ParenthesizedPattern)) || (kind == StructurePattern)
      ) || (((kind == TaggedPattern || (kind == VariablePattern)) || (kind == WildcardPattern)))) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool PatternSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::ExpressionPattern:
        case SyntaxKind::ParenthesizedPattern:
        case SyntaxKind::StructurePattern:
        case SyntaxKind::TaggedPattern:
        case SyntaxKind::VariablePattern:
        case SyntaxKind::WildcardPattern:
            return true;
        default:
            return false;
    }
}